

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

void flatbuffers::(anonymous_namespace)::
     SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__4,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
               (Offset<flatbuffers::Table> *begin,Offset<flatbuffers::Table> *end,size_t width,
               anon_class_8_1_ba1d59bf comparator,
               _func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *swapper)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  ushort *puVar5;
  int *piVar6;
  uint8_t *b;
  uint8_t *a;
  Offset<flatbuffers::Table> *a_00;
  Offset<flatbuffers::Table> *b_00;
  
  while (4 < (long)end - (long)begin) {
    a_00 = begin + 1;
    b_00 = end;
    if (a_00 < end) {
      do {
        uVar2 = *(ushort *)(width + 0x108);
        uVar4 = (ulong)begin->o;
        puVar5 = (ushort *)((long)&begin->o + (uVar4 - (long)*(int *)((long)&begin->o + uVar4)));
        if (uVar2 < *puVar5) {
          uVar3 = *(ushort *)((long)puVar5 + (ulong)uVar2);
        }
        else {
          uVar3 = 0;
        }
        piVar6 = (int *)((long)&a_00->o + (ulong)a_00->o);
        swapper = (_func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *)
                  -(long)*piVar6;
        if (uVar2 < *(ushort *)((long)piVar6 + (long)swapper)) {
          swapper = (_func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *)
                    ((long)piVar6 - (long)*piVar6);
          uVar2 = *(ushort *)(swapper + uVar2);
        }
        else {
          uVar2 = 0;
        }
        comparator.key = (FieldDef *)(ulong)uVar3;
        a = (uint8_t *)
            ((long)&begin->o +
            (long)&((comparator.key)->super_Definition).name._M_dataplus._M_p + uVar4);
        if (uVar3 == 0) {
          a = (uint8_t *)0x0;
        }
        b = (uint8_t *)((long)piVar6 + (ulong)uVar2);
        if (uVar2 == 0) {
          b = (uint8_t *)0x0;
        }
        bVar1 = anon_unknown_0::CompareSerializedScalars(a,b,(FieldDef *)width);
        if (bVar1) {
          b_00 = b_00 + -1;
          anon_unknown_0::SwapSerializedTables(a_00,b_00);
        }
        else {
          a_00 = a_00 + 1;
        }
      } while (a_00 < b_00);
    }
    anon_unknown_0::SwapSerializedTables(begin,a_00 + -1);
    SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__4,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
              (begin,a_00 + -1,width,comparator,swapper);
    begin = b_00;
  }
  return;
}

Assistant:

static void SimpleQsort(T *begin, T *end, size_t width, F comparator,
                        S swapper) {
  if (end - begin <= static_cast<ptrdiff_t>(width)) return;
  auto l = begin + width;
  auto r = end;
  while (l < r) {
    if (comparator(begin, l)) {
      r -= width;
      swapper(l, r);
    } else {
      l += width;
    }
  }
  l -= width;
  swapper(begin, l);
  SimpleQsort(begin, l, width, comparator, swapper);
  SimpleQsort(r, end, width, comparator, swapper);
}